

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

trie_node *
trie_lookup_exact(trie_node *root_node,lrtr_ip_addr *prefix,uint8_t mask_len,uint *lvl,_Bool *found)

{
  long lVar1;
  lrtr_ip_addr a;
  lrtr_ip_addr b;
  _Bool _Var2;
  trie_node *ptVar3;
  uint lvl_00;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *found = false;
  do {
    if (root_node == (trie_node *)0x0) {
      root_node = (trie_node *)0x0;
LAB_001128b2:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return root_node;
      }
      __stack_chk_fail();
    }
    lvl_00 = *lvl;
    if ((lvl_00 != 0) && (mask_len < root_node->len)) {
      *lvl = lvl_00 - 1;
      root_node = root_node->parent;
      goto LAB_001128b2;
    }
    if (root_node->len == mask_len) {
      a.u.addr6.addr[2] = in_stack_ffffffffffffff9c;
      a._0_12_ = *(undefined1 (*) [12])((long)&(root_node->prefix).u + 4);
      a.u.addr6.addr[3] = (int)*(undefined8 *)prefix;
      b.u.addr6.addr[2] = in_stack_ffffffffffffffb4;
      b._0_12_ = *(undefined1 (*) [12])((long)&prefix->u + 4);
      b.u.addr6.addr[3] = (int)*(undefined8 *)prefix;
      _Var2 = lrtr_ip_addr_equal(a,b);
      if (_Var2) {
        *found = true;
        goto LAB_001128b2;
      }
      lvl_00 = *lvl;
    }
    _Var2 = is_left_child(prefix,lvl_00);
    if (_Var2) {
      ptVar3 = root_node->lchild;
    }
    else {
      ptVar3 = root_node->rchild;
    }
    if (ptVar3 == (trie_node *)0x0) goto LAB_001128b2;
    *lvl = *lvl + 1;
    root_node = ptVar3;
  } while( true );
}

Assistant:

struct trie_node *trie_lookup_exact(struct trie_node *root_node, const struct lrtr_ip_addr *prefix,
				    const uint8_t mask_len, unsigned int *lvl, bool *found)
{
	*found = false;

	while (root_node) {
		if (*lvl > 0 && root_node->len > mask_len) {
			(*lvl)--;
			return root_node->parent;
		}

		if (root_node->len == mask_len && lrtr_ip_addr_equal(root_node->prefix, *prefix)) {
			*found = true;
			return root_node;
		}

		if (is_left_child(prefix, *lvl)) {
			if (!root_node->lchild)
				return root_node;
			root_node = root_node->lchild;
		} else {
			if (!root_node->rchild)
				return root_node;
			root_node = root_node->rchild;
		}

		(*lvl)++;
	}
	return NULL;
}